

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_pointgrid.cpp
# Opt level: O0

bool __thiscall ON_PointGrid::IsValid(ON_PointGrid *this,ON_TextLog *text_log)

{
  int point_count1;
  int iVar1;
  bool bVar2;
  int iVar3;
  ON_3dPoint *p;
  bool local_19;
  bool rc;
  ON_TextLog *text_log_local;
  ON_PointGrid *this_local;
  
  local_19 = false;
  iVar3 = this->m_point_count[0];
  point_count1 = this->m_point_count[1];
  iVar1 = this->m_point_stride0;
  p = ON_SimpleArray<ON_3dPoint>::operator[](&(this->m_point).super_ON_SimpleArray<ON_3dPoint>,0);
  bVar2 = ON_IsValidPointGrid(3,false,iVar3,point_count1,iVar1 * 3,3,&p->x);
  if (bVar2) {
    iVar3 = ON_SimpleArray<ON_3dPoint>::Count(&(this->m_point).super_ON_SimpleArray<ON_3dPoint>);
    local_19 = this->m_point_stride0 * this->m_point_count[0] <= iVar3;
  }
  return local_19;
}

Assistant:

bool ON_PointGrid::IsValid( ON_TextLog* text_log ) const
{
  bool rc = false;
  if ( ON_IsValidPointGrid( 3, false, 
                            m_point_count[0], m_point_count[1], 
                            m_point_stride0*3, 3, 
                            &m_point[0].x ) ) 
  {
    if ( m_point.Count() >= m_point_stride0*m_point_count[0] )
      rc = true;
  }
  return rc;
}